

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O0

bool recall_tree_ns::is_candidate(recall_tree *b,uint32_t cn,example *ec)

{
  node *pnVar1;
  node_pred **ppnVar2;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  bool bVar3;
  node_pred *ls;
  node_pred *local_28;
  
  pnVar1 = v_array<recall_tree_ns::node>::operator[]
                     ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)in_ESI);
  ppnVar2 = v_array<recall_tree_ns::node_pred>::begin(&pnVar1->preds);
  local_28 = *ppnVar2;
  while( true ) {
    pnVar1 = v_array<recall_tree_ns::node>::operator[]
                       ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)in_ESI);
    ppnVar2 = v_array<recall_tree_ns::node_pred>::end(&pnVar1->preds);
    bVar3 = false;
    if (local_28 != *ppnVar2) {
      pnVar1 = v_array<recall_tree_ns::node>::operator[]
                         ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)in_ESI);
      ppnVar2 = v_array<recall_tree_ns::node_pred>::begin(&pnVar1->preds);
      bVar3 = local_28 < *ppnVar2 + *(long *)(in_RDI + 0x30);
    }
    if (!bVar3) break;
    if (local_28->label == *(uint32_t *)(in_RDX + 0x6828)) {
      return true;
    }
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

bool is_candidate(recall_tree& b, uint32_t cn, example& ec)
{
  for (node_pred* ls = b.nodes[cn].preds.begin();
       ls != b.nodes[cn].preds.end() && ls < b.nodes[cn].preds.begin() + b.max_candidates; ++ls)
  {
    if (ls->label == ec.l.multi.label)
      return true;
  }

  return false;
}